

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

char * cm_zlib_gzerror(gzFile file,int *errnum)

{
  gzFile local_38;
  gzFile local_30;
  gz_statep state;
  int *errnum_local;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local = (gzFile)0x0;
  }
  else if ((file[1].have == 0x1c4f) || (file[1].have == 0x79b1)) {
    if (errnum != (int *)0x0) {
      *errnum = *(int *)((long)&file[4].pos + 4);
    }
    if (*(int *)((long)&file[4].pos + 4) == -4) {
      local_30 = (gzFile)0x118e6c8;
    }
    else {
      if (*(long *)(file + 5) == 0) {
        local_38 = (gzFile)0x1193827;
      }
      else {
        local_38 = *(gzFile *)(file + 5);
      }
      local_30 = local_38;
    }
    file_local = local_30;
  }
  else {
    file_local = (gzFile)0x0;
  }
  return (char *)file_local;
}

Assistant:

const char * ZEXPORT gzerror(gzFile file, int *errnum) {
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return NULL;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return NULL;

    /* return error information */
    if (errnum != NULL)
        *errnum = state->err;
    return state->err == Z_MEM_ERROR ? "out of memory" :
                                       (state->msg == NULL ? "" : state->msg);
}